

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_x_pjs18.c
# Opt level: O2

void lc_tmlyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double omega;
  double local_20;
  
  local_20 = get_ext_param(p,ext_params,0);
  set_ext_params_lc(p,ext_params);
  xc_func_set_ext_params(*p->func_aux,&local_20);
  return;
}

Assistant:

static void lc_tmlyp_set_ext_params(xc_func_type *p, const double *ext_params) {
  double omega;

  omega = get_ext_param(p, ext_params, 0);

  /* 100% long-range exact exchange */
  set_ext_params_lc(p, ext_params);

  /* Set the parameters for js18 */
  xc_func_set_ext_params(p->func_aux[0], &omega);
}